

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::iterate
          (TextureBorderClampPerAxisCase3D *this)

{
  GenericVec4 *pGVar1;
  TextureFormat format;
  code *pcVar2;
  RenderContext *context;
  Texture3D *pTVar3;
  TestLog *pTVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_EAX;
  uint uVar7;
  char *pcVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  SeedBuilder *pSVar11;
  byte bVar12;
  string *baseView;
  Surface *pSVar13;
  Vector<float,_4> *value;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar14;
  undefined1 auVar15 [16];
  allocator<char> local_40c;
  allocator<char> local_40b;
  allocator<char> local_40a;
  allocator<char> local_409;
  Surface renderedFrame;
  LodPrecision lodPrecision;
  string local_3e0;
  PixelBufferAccess local_3c0;
  string local_398;
  string local_378;
  Surface reference;
  Surface errorMask;
  string borderColorString;
  PixelFormat pixelFormat;
  undefined1 local_288 [32];
  _func_int **pp_Stack_268;
  BVec4 local_260;
  undefined1 local_25c [72];
  WrapMode WStack_214;
  undefined8 uStack_210;
  size_type local_208;
  undefined8 uStack_200;
  int local_1f8;
  anon_union_16_3_1194ccdc_for_v local_1f4;
  undefined8 local_1e4;
  LodMode local_1dc;
  IVec4 colorBits;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int local_198;
  undefined8 local_184;
  long lVar9;
  
  tcu::Surface::Surface(&renderedFrame,0x80,0x80);
  format = (((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
             .m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_format;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_25c,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)local_1b8,this->m_sWrap,this->m_tWrap,this->m_rWrap,this->m_filter,
                    this->m_filter);
  local_1f8 = local_198;
  local_208 = local_1a8._M_allocated_capacity;
  uStack_200 = local_1a8._8_8_;
  local_25c._68_4_ = local_1b8._0_4_;
  WStack_214 = local_1b8._4_4_;
  uStack_210 = pp_Stack_1b0;
  local_1e4 = local_184;
  local_1f4._0_8_ = *(undefined8 *)&(this->m_borderColor).v;
  local_1f4._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
  local_1dc = LODMODE_EXACT;
  local_25c._4_4_ = glu::TextureTestUtil::getSamplerType(format);
  pGVar1 = &this->m_borderColor;
  local_25c._36_8_ = *(undefined8 *)(this->m_lookupScale).m_data;
  local_25c._44_8_ = *(undefined8 *)((this->m_lookupScale).m_data + 2);
  local_25c._52_8_ = *(undefined8 *)(this->m_lookupBias).m_data;
  local_25c._60_8_ = *(undefined8 *)((this->m_lookupBias).m_data + 2);
  if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_1b8 = *(undefined1 (*) [8])&pGVar1->v;
    pp_Stack_1b0 = *(_func_int ***)((long)&(this->m_borderColor).v + 8);
    de::toString<tcu::Vector<unsigned_int,4>>
              (&borderColorString,(de *)local_1b8,(Vector<unsigned_int,_4> *)value);
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_1b8 = *(undefined1 (*) [8])&pGVar1->v;
    pp_Stack_1b0 = *(_func_int ***)((long)&(this->m_borderColor).v + 8);
    de::toString<tcu::Vector<int,4>>(&borderColorString,(de *)local_1b8,(Vector<int,_4> *)value);
  }
  else {
    local_1b8 = *(undefined1 (*) [8])&pGVar1->v;
    pp_Stack_1b0 = *(_func_int ***)((long)&(this->m_borderColor).v + 8);
    de::toString<tcu::Vector<float,4>>(&borderColorString,(de *)local_1b8,value);
  }
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,"Border color is ");
  std::operator<<((ostream *)&pp_Stack_1b0,(string *)&borderColorString);
  std::operator<<((ostream *)&pp_Stack_1b0,"\n");
  std::operator<<((ostream *)&pp_Stack_1b0,"Texture lookup bias: ");
  tcu::operator<<((ostream *)&pp_Stack_1b0,(Vector<float,_4> *)(local_25c + 0x34));
  std::operator<<((ostream *)&pp_Stack_1b0,"\n");
  std::operator<<((ostream *)&pp_Stack_1b0,"Texture lookup scale: ");
  tcu::operator<<((ostream *)&pp_Stack_1b0,(Vector<float,_4> *)(local_25c + 0x24));
  std::operator<<((ostream *)&pp_Stack_1b0,"\n");
  std::operator<<((ostream *)&pp_Stack_1b0,"Filter: ");
  pcVar8 = glu::getTextureFilterName(this->m_filter);
  std::operator<<((ostream *)&pp_Stack_1b0,pcVar8);
  std::operator<<((ostream *)&pp_Stack_1b0,"\n");
  std::operator<<((ostream *)&pp_Stack_1b0,"Wrap mode: s = ");
  local_288._0_8_ = glu::getRepeatModeName;
  local_288._8_4_ = this->m_sWrap;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_288,(ostream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,", t = ");
  local_3c0.super_ConstPixelBufferAccess.m_size.m_data[0] = this->m_tWrap;
  local_3c0.super_ConstPixelBufferAccess.m_format = (TextureFormat)glu::getRepeatModeName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_3c0,(ostream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,", r = ");
  local_3e0._M_dataplus._M_p = (pointer)glu::getRepeatModeName;
  local_3e0._M_string_length = CONCAT44(local_3e0._M_string_length._4_4_,this->m_rWrap);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_3e0,(ostream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__cxx11::string::~string((string *)&borderColorString);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::SeedBuilder::SeedBuilder((SeedBuilder *)&borderColorString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p,
             (allocator<char> *)local_288);
  pSVar11 = tcu::operator<<((SeedBuilder *)&borderColorString,(string *)local_1b8);
  pSVar11 = tcu::operator<<(pSVar11,this->m_texFormat);
  pSVar11 = tcu::operator<<(pSVar11,this->m_filter);
  pSVar11 = tcu::operator<<(pSVar11,this->m_sWrap);
  pSVar11 = tcu::operator<<(pSVar11,this->m_tWrap);
  pSVar11 = tcu::operator<<(pSVar11,this->m_rWrap);
  pSVar11 = tcu::operator<<(pSVar11,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_width);
  pSVar11 = tcu::operator<<(pSVar11,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_height);
  tcu::operator<<(pSVar11,(((this->m_texture).
                            super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
                            m_data.ptr)->m_refTexture).m_depth);
  std::__cxx11::string::~string((string *)local_1b8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&borderColorString,pRVar10,0x80,0x80,
             (deUint32)borderColorString._M_dataplus._M_p);
  (**(code **)(lVar9 + 8))(0x84c0);
  (**(code **)(lVar9 + 0xb8))
            (0x806f,((this->m_texture).
                     super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data.
                    ptr)->m_glTexture);
  pcVar2 = *(code **)(lVar9 + 0x1360);
  dVar6 = glu::getGLWrapMode(local_25c._68_4_);
  (*pcVar2)(0x806f,0x2802,dVar6);
  pcVar2 = *(code **)(lVar9 + 0x1360);
  dVar6 = glu::getGLWrapMode(WStack_214);
  (*pcVar2)(0x806f,0x2803,dVar6);
  pcVar2 = *(code **)(lVar9 + 0x1360);
  dVar6 = glu::getGLWrapMode((WrapMode)uStack_210);
  (*pcVar2)(0x806f,0x8072,dVar6);
  pcVar2 = *(code **)(lVar9 + 0x1360);
  dVar6 = glu::getGLFilterMode(uStack_210._4_4_);
  (*pcVar2)(0x806f,0x2801,dVar6);
  pcVar2 = *(code **)(lVar9 + 0x1360);
  dVar6 = glu::getGLFilterMode((FilterMode)local_208);
  (*pcVar2)(0x806f,0x2800,dVar6);
  if ((ulong)this->m_channelClass < 5) {
    (**(code **)(lVar9 + *(long *)(&DAT_018aaf18 + (ulong)this->m_channelClass * 8)))
              (0x806f,0x1004,pGVar1);
  }
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x897);
  (**(code **)(lVar9 + 0x1a00))
            ((ulong)borderColorString._M_dataplus._M_p & 0xffffffff,
             borderColorString._M_dataplus._M_p._4_4_,
             borderColorString._M_string_length & 0xffffffff,
             borderColorString._M_string_length._4_4_);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            ((this->m_renderer).
             super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
             .m_data.ptr,0,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(RenderParams *)local_25c);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b8,&renderedFrame);
  glu::readPixels(context,(deUint32)borderColorString._M_dataplus._M_p,
                  borderColorString._M_dataplus._M_p._4_4_,(PixelBufferAccess *)local_1b8);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  borderColorString._M_dataplus._M_p = *(pointer *)&pRVar10->m_pixelFormat;
  borderColorString._M_string_length._0_4_ = (pRVar10->m_pixelFormat).blueBits;
  borderColorString._M_string_length._4_4_ = (pRVar10->m_pixelFormat).alphaBits;
  pixelFormat._0_8_ = borderColorString._M_dataplus._M_p;
  pixelFormat._8_8_ = borderColorString._M_string_length;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_288,2);
  tcu::operator-((tcu *)local_1b8,(Vector<int,_4> *)&borderColorString,(Vector<int,_4> *)local_288);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3c0,0);
  tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1b8,(Vector<int,_4> *)&local_3c0);
  tcu::Surface::Surface(&reference,renderedFrame.m_width,renderedFrame.m_height);
  tcu::Surface::Surface(&errorMask,renderedFrame.m_width,renderedFrame.m_height);
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_288);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 5;
  tcu::computeFixedPointThreshold((tcu *)&borderColorString,&colorBits);
  tcu::operator/((tcu *)local_1b8,(Vector<float,_4> *)&borderColorString,
                 (Vector<float,_4> *)(local_25c + 0x24));
  local_288._24_8_ = local_1b8;
  pp_Stack_268 = pp_Stack_1b0;
  local_288._0_8_ = (GetNameFunc)0x1400000014;
  local_288._8_4_ = 0;
  local_288._12_4_ = 5;
  local_288._16_4_ = 5;
  local_288._20_4_ = 0;
  auVar15._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar15._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar15._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar15._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar7 = movmskps(extraout_EAX,auVar15);
  bVar12 = (byte)uVar7;
  local_260.m_data =
       (bool  [4])
       (uVar7 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
       (uint)(bVar12 >> 3) << 0x18);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_1b8,&reference,&pixelFormat);
  pTVar3 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  borderColorString._M_string_length = (size_type)(pTVar3->m_refTexture).m_view.m_levels;
  borderColorString._M_dataplus._M_p._0_4_ = (pTVar3->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1b8,(Texture3DView *)&borderColorString,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_25c);
  tcu::Surface::getAccess((ConstPixelBufferAccess *)local_1b8,&renderedFrame);
  tcu::Surface::getAccess((PixelBufferAccess *)&borderColorString,&reference);
  tcu::Surface::getAccess(&local_3c0,&errorMask);
  pTVar3 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  local_3e0._M_string_length = (size_type)(pTVar3->m_refTexture).m_view.m_levels;
  baseView = &local_3e0;
  local_3e0._M_dataplus._M_p._0_4_ = (pTVar3->m_refTexture).m_view.m_numLevels;
  iVar5 = glu::TextureTestUtil::computeTextureLookupDiff
                    ((ConstPixelBufferAccess *)local_1b8,
                     (ConstPixelBufferAccess *)&borderColorString,&local_3c0,
                     (Texture3DView *)baseView,
                     (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_25c,
                     (LookupPrecision *)local_288,&lodPrecision,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog);
  if (0 < iVar5) {
    local_1b8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"ERROR: Result verification failed, got ");
    std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar5);
    std::operator<<((ostream *)&pp_Stack_1b0," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  }
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"VerifyResult",&local_409)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"Verification result",&local_40a);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&borderColorString,(string *)&local_3c0,&local_3e0);
  iVar14 = (int)pTVar4;
  tcu::LogImageSet::write((LogImageSet *)&borderColorString,iVar14,__buf,(size_t)baseView);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Rendered",&local_40b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"Rendered image",&local_40c);
  pSVar13 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b8,&local_378,&local_398,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b8,iVar14,__buf_00,(size_t)pSVar13);
  tcu::LogImage::~LogImage((LogImage *)local_1b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&borderColorString);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (0 < iVar5) {
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Reference",&local_409);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Ideal reference image",&local_40a);
    pSVar13 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)&local_3c0,&local_3e0,pSVar13,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar14 = (int)pTVar4;
    tcu::LogImage::write((LogImage *)local_1b8,iVar14,__buf_01,(size_t)pSVar13);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"ErrorMask",&local_40b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Error mask",&local_40c)
    ;
    pSVar13 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&borderColorString,&local_378,&local_398,pSVar13,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&borderColorString,iVar14,__buf_02,(size_t)pSVar13);
    tcu::LogImage::~LogImage((LogImage *)&borderColorString);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    tcu::LogImage::~LogImage((LogImage *)local_1b8);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  pcVar8 = "Pass";
  if (iVar5 != 0) {
    pcVar8 = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar5 != 0),
             pcVar8);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureBorderClampPerAxisCase3D::IterateResult TextureBorderClampPerAxisCase3D::iterate (void)
{
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= getSamplerParams();

	logParams(samplerParams);
	renderTo(renderedFrame, samplerParams);
	verifyImage(renderedFrame, samplerParams);

	return STOP;
}